

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDBusMenuEvent>::moveAppend
          (QGenericArrayOps<QDBusMenuEvent> *this,QDBusMenuEvent *b,QDBusMenuEvent *e)

{
  undefined8 *puVar1;
  QDBusMenuEvent *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  PrivateShared *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  qsizetype qVar9;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QDBusMenuEvent>).ptr;
    qVar9 = (this->super_QArrayDataPointer<QDBusMenuEvent>).size;
    do {
      pQVar2[qVar9].m_id = b->m_id;
      pDVar3 = (b->m_eventId).d.d;
      (b->m_eventId).d.d = (Data *)0x0;
      pQVar2[qVar9].m_eventId.d.d = pDVar3;
      pcVar4 = (b->m_eventId).d.ptr;
      (b->m_eventId).d.ptr = (char16_t *)0x0;
      pQVar2[qVar9].m_eventId.d.ptr = pcVar4;
      qVar5 = (b->m_eventId).d.size;
      (b->m_eventId).d.size = 0;
      pQVar2[qVar9].m_eventId.d.size = qVar5;
      pPVar6 = (b->m_data).m_variant.d.data.shared;
      uVar7 = *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 8);
      uVar8 = *(undefined8 *)&(b->m_data).m_variant.d.field_0x18;
      puVar1 = (undefined8 *)((long)&pQVar2[qVar9].m_data.m_variant.d.data + 0x10);
      *puVar1 = *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 0x10);
      puVar1[1] = uVar8;
      pQVar2[qVar9].m_data.m_variant.d.data.shared = pPVar6;
      *(undefined8 *)((long)&pQVar2[qVar9].m_data.m_variant.d.data + 8) = uVar7;
      (b->m_data).m_variant.d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 8) = 0;
      *(undefined8 *)((long)&(b->m_data).m_variant.d.data + 0x10) = 0;
      *(undefined8 *)&(b->m_data).m_variant.d.field_0x18 = 2;
      pQVar2[qVar9].m_timestamp = b->m_timestamp;
      b = b + 1;
      qVar9 = (this->super_QArrayDataPointer<QDBusMenuEvent>).size + 1;
      (this->super_QArrayDataPointer<QDBusMenuEvent>).size = qVar9;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }